

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O1

void __thiscall HashMap_Basics_Test::~HashMap_Basics_Test(HashMap_Basics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashMap, Basics) {
    Allocator alloc;
    HashMap<int, std::string, std::hash<int>> map(alloc);

    map.Insert(1, std::string("yolo"));
    map.Insert(10, std::string("hello"));
    map.Insert(42, std::string("test"));

    EXPECT_EQ(3, map.size());
    EXPECT_GE(map.capacity(), 3);
    EXPECT_TRUE(map.HasKey(1));
    EXPECT_TRUE(map.HasKey(10));
    EXPECT_TRUE(map.HasKey(42));
    EXPECT_FALSE(map.HasKey(0));
    EXPECT_FALSE(map.HasKey(1240));
    EXPECT_EQ("yolo", map[1]);
    EXPECT_EQ("hello", map[10]);
    EXPECT_EQ("test", map[42]);

    map.Insert(10, std::string("hai"));
    EXPECT_EQ(3, map.size());
    EXPECT_GE(map.capacity(), 3);
    EXPECT_EQ("hai", map[10]);
}